

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_buf.c
# Opt level: O3

char * lj_buf_more2(SBuf *sb,MSize sz)

{
  ulong uVar1;
  char *pcVar2;
  uint sz_00;
  SBufExt *sbx;
  int iVar3;
  MSize sz_01;
  int iVar4;
  char *__dest;
  uint uVar5;
  ulong uVar6;
  
  uVar1 = (sb->L).ptr64;
  iVar3 = (int)sb->w;
  if ((uVar1 & 1) == 0) {
    if ((0x7fffff00 < sz) || (sz_01 = (iVar3 - *(int *)&sb->b) + sz, 0x7fffff00 < sz_01))
    goto LAB_00110124;
LAB_0011009a:
    buf_grow(sb,sz_01);
  }
  else {
    if (0x7fffff00 < sz) {
LAB_00110124:
      lj_err_mem((lua_State *)(uVar1 & 0xfffffffffffffff8));
    }
    pcVar2 = sb[1].e;
    uVar6 = (long)sb->w - (long)pcVar2;
    sz_00 = (int)uVar6 + sz;
    if (0x7fffff00 < sz_00) goto LAB_00110124;
    __dest = sb->b;
    iVar4 = (int)__dest;
    uVar5 = *(int *)&sb->e - iVar4;
    if (uVar5 < sz_00) {
      buf_grow(sb,sz_00);
      __dest = sb->b;
      pcVar2 = sb[1].e;
    }
    else if ((uint)((int)pcVar2 - iVar4) < uVar5 >> 3) {
      sz_01 = (iVar3 - iVar4) + sz;
      goto LAB_0011009a;
    }
    if (pcVar2 != __dest) {
      uVar6 = uVar6 & 0xffffffff;
      memmove(__dest,pcVar2,uVar6);
      pcVar2 = sb->b;
      sb[1].e = pcVar2;
      sb->w = pcVar2 + uVar6;
    }
  }
  return sb->w;
}

Assistant:

LJ_NOINLINE char *LJ_FASTCALL lj_buf_more2(SBuf *sb, MSize sz)
{
  if (sbufisext(sb)) {
    SBufExt *sbx = (SBufExt *)sb;
    MSize len = sbufxlen(sbx);
    if (LJ_UNLIKELY(sz > LJ_MAX_BUF || len + sz > LJ_MAX_BUF))
      lj_err_mem(sbufL(sbx));
    if (len + sz > sbufsz(sbx)) {  /* Must grow. */
      buf_grow((SBuf *)sbx, len + sz);
    } else if (sbufxslack(sbx) < (sbufsz(sbx) >> 3)) {
      /* Also grow to avoid excessive compactions, if slack < size/8. */
      buf_grow((SBuf *)sbx, sbuflen(sbx) + sz);  /* Not sbufxlen! */
      return sbx->w;
    }
    if (sbx->r != sbx->b) {  /* Compact by moving down. */
      memmove(sbx->b, sbx->r, len);
      sbx->r = sbx->b;
      sbx->w = sbx->b + len;
      lj_assertG_(G(sbufL(sbx)), len + sz <= sbufsz(sbx), "bad SBuf compact");
    }
  } else {
    MSize len = sbuflen(sb);
    lj_assertG_(G(sbufL(sb)), sz > sbufleft(sb), "SBuf overflow");
    if (LJ_UNLIKELY(sz > LJ_MAX_BUF || len + sz > LJ_MAX_BUF))
      lj_err_mem(sbufL(sb));
    buf_grow(sb, len + sz);
  }
  return sb->w;
}